

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

int math_max(lua_State *L)

{
  int iVar1;
  int iVar2;
  int index2;
  int idx;
  
  iVar1 = lua_gettop(L);
  if (iVar1 < 1) {
    luaL_argerror(L,1,"value expected");
  }
  index2 = 2;
  idx = 1;
  while( true ) {
    if (iVar1 < index2) break;
    iVar2 = lua_compare(L,idx,index2,1);
    if (iVar2 != 0) {
      idx = index2;
    }
    index2 = index2 + 1;
  }
  lua_pushvalue(L,idx);
  return 1;
}

Assistant:

static int math_max (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int imax = 1;  /* index of current maximum value */
  int i;
  luaL_argcheck(L, n >= 1, 1, "value expected");
  for (i = 2; i <= n; i++) {
    if (lua_compare(L, imax, i, LUA_OPLT))
      imax = i;
  }
  lua_pushvalue(L, imax);
  return 1;
}